

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall t_netstd_generator::generate_struct(t_netstd_generator *this,t_struct *tstruct)

{
  bool bVar1;
  t_struct *tstruct_local;
  t_netstd_generator *this_local;
  
  collect_extensions_types(this,tstruct);
  bVar1 = is_union_enabled(this);
  if ((bVar1) && (bVar1 = t_struct::is_union(tstruct), bVar1)) {
    generate_netstd_union(this,tstruct);
  }
  else {
    generate_netstd_struct(this,tstruct,false);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_struct(t_struct* tstruct)
{
    collect_extensions_types(tstruct);

    if (is_union_enabled() && tstruct->is_union())
    {
        generate_netstd_union(tstruct);
    }
    else
    {
        generate_netstd_struct(tstruct, false);
    }
}